

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

void capnp::_::WireHelpers::zeroObject
               (SegmentBuilder *segment,CapTableBuilder *capTable,WirePointer *tag,word *ptr)

{
  Kind KVar1;
  ushort uVar2;
  unsigned_long uVar3;
  int iVar4;
  uint uVar5;
  WirePointer *typedPtr;
  Iterator __begin6;
  ulong uVar6;
  uint uVar7;
  WirePointer *pWVar8;
  uint uVar9;
  bool bVar10;
  Iterator __end7;
  Fault f;
  Fault f_2;
  DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> local_68;
  ulong local_48;
  word *local_40;
  Fault local_38;
  
  if (segment->readOnly != false) {
    return;
  }
  switch((tag->offsetAndKind).value & 3) {
  case 0:
    pWVar8 = (WirePointer *)(ptr + (tag->field_1).structRef.dataSize.value);
    uVar6 = (ulong)(tag->field_1).structRef.ptrCount.value;
    while (bVar10 = uVar6 != 0, uVar6 = uVar6 - 1, bVar10) {
      zeroObject(segment,capTable,pWVar8);
      pWVar8 = pWVar8 + 1;
    }
    iVar4 = (uint)(tag->field_1).structRef.ptrCount.value +
            (uint)(tag->field_1).structRef.dataSize.value;
    if (iVar4 == 0) {
      return;
    }
    uVar5 = iVar4 * 8;
    break;
  case 1:
    uVar5 = (tag->field_1).upper32Bits;
    switch(uVar5 & 7) {
    case 0:
      return;
    default:
      uVar6 = (ulong)*(uint *)(BITS_PER_ELEMENT_TABLE + (ulong)((byte)uVar5 & 7) * 4) *
              (ulong)(uVar5 >> 3) + 0x3f;
      if ((int)(uVar6 >> 6) == 0) {
        return;
      }
      uVar5 = (uint)(uVar6 >> 3) & 0xfffffff8;
      break;
    case 6:
      for (uVar6 = 0; (uVar5 & 0xfffffff8) != uVar6; uVar6 = uVar6 + 8) {
        zeroObject(segment,capTable,(WirePointer *)((long)&ptr->content + uVar6));
      }
      if (uVar5 < 8) {
        return;
      }
      uVar5 = uVar5 & 0xfffffff8;
      break;
    case 7:
      KVar1 = (Kind)ptr->content;
      local_68.right = STRUCT;
      local_68.left = KVar1 & OTHER;
      local_68.result = local_68.left == STRUCT;
      local_68.op.content.ptr = " == ";
      local_68.op.content.size_ = 5;
      if (!local_68.result) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[54]>
                  (&local_38,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x2c8,FAILED,"elementTag->kind() == WirePointer::STRUCT",
                   "_kjCondition,\"Don\'t know how to handle non-STRUCT inline composite.\"",
                   &local_68,(char (*) [54])"Don\'t know how to handle non-STRUCT inline composite."
                  );
        kj::_::Debug::Fault::fatal(&local_38);
      }
      uVar5 = KVar1 >> 2 & 0x1fffffff;
      uVar6 = 0;
      uVar2 = *(ushort *)((long)&ptr->content + 4);
      uVar7 = (uint)*(ushort *)((long)&ptr->content + 6);
      local_68.left = STRUCT;
      if (uVar7 != 0) {
        local_48 = (ulong)uVar2;
        pWVar8 = (WirePointer *)(ptr + 1);
        local_40 = ptr;
        for (; (uint)uVar6 != uVar5; uVar6 = (ulong)((uint)uVar6 + 1)) {
          pWVar8 = pWVar8 + local_48;
          uVar9 = uVar7;
          while (bVar10 = uVar9 != 0, uVar9 = uVar9 - 1, bVar10) {
            zeroObject(segment,capTable,pWVar8);
            pWVar8 = pWVar8 + 1;
          }
        }
        uVar2 = *(ushort *)((long)&local_40->content + 4);
        uVar6 = (ulong)*(ushort *)((long)&local_40->content + 6);
        ptr = local_40;
      }
      uVar3 = assertMaxBits<29u,unsigned_long,capnp::_::WireHelpers::zeroObject(capnp::_::SegmentBuilder*,capnp::_::CapTableBuilder*,capnp::_::WirePointer*,capnp::word*)::_lambda()_1_>
                        ((uVar2 + uVar6) * (ulong)uVar5 + 1,(anon_class_1_0_00000001 *)&local_68);
      if ((int)uVar3 == 0) {
        return;
      }
      memset(ptr,0,(ulong)(uint)((int)uVar3 << 3));
      return;
    }
    break;
  case 2:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
              ((Fault *)&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0x2e5,FAILED,(char *)0x0,"\"Unexpected FAR pointer.\"",
               (char (*) [24])"Unexpected FAR pointer.");
    goto LAB_00156f99;
  case 3:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26]>
              ((Fault *)&local_68,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0x2ea,FAILED,(char *)0x0,"\"Unexpected OTHER pointer.\"",
               (char (*) [26])"Unexpected OTHER pointer.");
LAB_00156f99:
    kj::_::Debug::Fault::~Fault((Fault *)&local_68);
    return;
  }
  memset(ptr,0,(ulong)uVar5);
  return;
}

Assistant:

static void zeroObject(SegmentBuilder* segment, CapTableBuilder* capTable,
                         WirePointer* tag, word* ptr) {
    // We shouldn't zero out external data linked into the message.
    if (!segment->isWritable()) return;

    switch (tag->kind()) {
      case WirePointer::STRUCT: {
        WirePointer* pointerSection =
            reinterpret_cast<WirePointer*>(ptr + tag->structRef.dataSize.get());
        for (auto i: kj::zeroTo(tag->structRef.ptrCount.get())) {
          zeroObject(segment, capTable, pointerSection + i);
        }
        zeroMemory(ptr, tag->structRef.wordSize());
        break;
      }
      case WirePointer::LIST: {
        switch (tag->listRef.elementSize()) {
          case ElementSize::VOID:
            // Nothing.
            break;
          case ElementSize::BIT:
          case ElementSize::BYTE:
          case ElementSize::TWO_BYTES:
          case ElementSize::FOUR_BYTES:
          case ElementSize::EIGHT_BYTES: {
            zeroMemory(ptr, roundBitsUpToWords(
                upgradeBound<uint64_t>(tag->listRef.elementCount()) *
                dataBitsPerElement(tag->listRef.elementSize())));
            break;
          }
          case ElementSize::POINTER: {
            WirePointer* typedPtr = reinterpret_cast<WirePointer*>(ptr);
            auto count = tag->listRef.elementCount() * (ONE * POINTERS / ELEMENTS);
            for (auto i: kj::zeroTo(count)) {
              zeroObject(segment, capTable, typedPtr + i);
            }
            zeroMemory(typedPtr, count);
            break;
          }
          case ElementSize::INLINE_COMPOSITE: {
            WirePointer* elementTag = reinterpret_cast<WirePointer*>(ptr);

            KJ_ASSERT(elementTag->kind() == WirePointer::STRUCT,
                  "Don't know how to handle non-STRUCT inline composite.");
            WordCount dataSize = elementTag->structRef.dataSize.get();
            WirePointerCount pointerCount = elementTag->structRef.ptrCount.get();

            auto count = elementTag->inlineCompositeListElementCount();
            if (pointerCount > ZERO * POINTERS) {
              word* pos = ptr + POINTER_SIZE_IN_WORDS;
              for (auto i KJ_UNUSED: kj::zeroTo(count)) {
                pos += dataSize;

                for (auto j KJ_UNUSED: kj::zeroTo(pointerCount)) {
                  zeroObject(segment, capTable, reinterpret_cast<WirePointer*>(pos));
                  pos += POINTER_SIZE_IN_WORDS;
                }
              }
            }

            auto wordsPerElement = elementTag->structRef.wordSize() / ELEMENTS;
            zeroMemory(ptr, assertMaxBits<SEGMENT_WORD_COUNT_BITS>(POINTER_SIZE_IN_WORDS +
                upgradeBound<uint64_t>(count) * wordsPerElement, []() {
                  KJ_FAIL_ASSERT("encountered list pointer in builder which is too large to "
                      "possibly fit in a segment. Bug in builder code?");
                }));
            break;
          }
        }
        break;
      }
      case WirePointer::FAR:
        KJ_FAIL_ASSERT("Unexpected FAR pointer.") {
          break;
        }
        break;
      case WirePointer::OTHER:
        KJ_FAIL_ASSERT("Unexpected OTHER pointer.") {
          break;
        }
        break;
    }
  }